

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lazy_ostream.hpp
# Opt level: O2

ostream * __thiscall
boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[25],_const_char_(&)[25]>::
operator()(lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[25],_const_char_(&)[25]> *this,
          ostream *ostr)

{
  int iVar1;
  undefined4 extraout_var;
  ostream *poVar2;
  
  iVar1 = (*this->m_prev->_vptr_lazy_ostream[2])();
  poVar2 = std::operator<<((ostream *)CONCAT44(extraout_var,iVar1),*this->m_value);
  return poVar2;
}

Assistant:

virtual std::ostream&   operator()( std::ostream& ostr ) const
    {
        return m_prev(ostr) << m_value;
    }